

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.h
# Opt level: O2

Vector3<double> * __thiscall
S2::GetSurfaceIntegral<Vector3<double>>
          (Vector3<double> *__return_storage_ptr__,S2 *this,S2PointLoopSpan loop,
          _func_Vector3<double>_S2Point_ptr_S2Point_ptr_S2Point_ptr *f_tri)

{
  bool bVar1;
  reference pVVar2;
  reference pVVar3;
  code *pcVar4;
  int i;
  ulong uVar5;
  FloatType FVar6;
  double dVar7;
  S2Point origin;
  S2PointLoopSpan loop_local;
  S2Point old_origin;
  D local_68;
  ulong local_50;
  BasicVector<Vector3,_double,_3UL> local_48 [24];
  
  pcVar4 = (code *)loop.super_S2PointSpan.len_;
  loop_local.super_S2PointSpan.len_ = (size_type)loop.super_S2PointSpan.ptr_;
  __return_storage_ptr__->c_[0] = 0.0;
  __return_storage_ptr__->c_[1] = 0.0;
  __return_storage_ptr__->c_[2] = 0.0;
  if ((pointer)0x2 < loop_local.super_S2PointSpan.len_) {
    loop_local.super_S2PointSpan.ptr_ = (pointer)this;
    pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
    origin.c_[0] = pVVar2->c_[0];
    origin.c_[1] = pVVar2->c_[1];
    origin.c_[2] = pVVar2->c_[2];
    i = 1;
    for (uVar5 = 2; uVar5 < loop_local.super_S2PointSpan.len_; uVar5 = uVar5 + 1) {
      if (uVar5 != 2) {
        pVVar2 = S2PointLoopSpan::operator[](&loop_local,i);
        FVar6 = Vector3<double>::Angle((Vector3<double> *)&origin,pVVar2);
        if (3.141582653589793 <= FVar6) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&old_origin,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                     ,0xef,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)old_origin.c_[1],
                          "Check failed: i == 1 || origin.Angle(loop[i]) < kMaxLength ");
          goto LAB_0023fb04;
        }
      }
      pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                        ((BasicVector<Vector3,_double,_3UL> *)&origin,pVVar2);
      if (!bVar1) {
        pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
        dVar7 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::DotProd
                          ((BasicVector<Vector3,_double,_3UL> *)&origin,pVVar2);
        if (1e-15 <= ABS(dVar7)) {
          S2LogMessage::S2LogMessage
                    ((S2LogMessage *)&old_origin,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.h"
                     ,0xf0,kFatal,(ostream *)&std::cerr);
          std::operator<<((ostream *)old_origin.c_[1],
                          "Check failed: origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15 "
                         );
LAB_0023fb04:
          abort();
        }
      }
      pVVar2 = S2PointLoopSpan::operator[](&loop_local,(int)uVar5);
      FVar6 = Vector3<double>::Angle(pVVar2,(Vector3<double> *)&origin);
      local_50 = uVar5;
      if (3.141582653589793 < FVar6) {
        old_origin.c_[2] = origin.c_[2];
        old_origin.c_[0] = origin.c_[0];
        old_origin.c_[1] = origin.c_[1];
        pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
        bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                          ((BasicVector<Vector3,_double,_3UL> *)&origin,pVVar2);
        if (bVar1) {
          pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
          pVVar3 = S2PointLoopSpan::operator[](&loop_local,i);
          RobustCrossProd((Vector3_d *)local_48,pVVar2,pVVar3);
          util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::Normalize
                    (&local_68,local_48);
          origin.c_[2] = local_68.c_[2];
          origin.c_[0] = local_68.c_[0];
          origin.c_[1] = local_68.c_[1];
        }
        else {
          pVVar2 = S2PointLoopSpan::operator[](&loop_local,i);
          pVVar3 = S2PointLoopSpan::operator[](&loop_local,0);
          FVar6 = Vector3<double>::Angle(pVVar2,pVVar3);
          if (3.141582653589793 <= FVar6) {
            pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
            Vector3<double>::CrossProd(pVVar2,&old_origin);
            origin.c_[2] = local_68.c_[2];
            origin.c_[0] = local_68.c_[0];
            origin.c_[1] = local_68.c_[1];
            pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
            (*pcVar4)(&local_68,pVVar2,&old_origin,&origin);
            util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                      (__return_storage_ptr__,&local_68);
          }
          else {
            pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
            origin.c_[0] = pVVar2->c_[0];
            origin.c_[1] = pVVar2->c_[1];
            origin.c_[2] = pVVar2->c_[2];
          }
        }
        pVVar2 = S2PointLoopSpan::operator[](&loop_local,i);
        (*pcVar4)(&local_68,&old_origin,pVVar2,&origin);
        util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                  (__return_storage_ptr__,&local_68);
      }
      pVVar2 = S2PointLoopSpan::operator[](&loop_local,i);
      uVar5 = local_50;
      pVVar3 = S2PointLoopSpan::operator[](&loop_local,(int)local_50);
      (*pcVar4)(&old_origin,&origin,pVVar2,pVVar3);
      util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                (__return_storage_ptr__);
      i = i + 1;
    }
    pVVar2 = S2PointLoopSpan::operator[](&loop_local,0);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator!=
                      ((BasicVector<Vector3,_double,_3UL> *)&origin,pVVar2);
    if (bVar1) {
      pVVar2 = S2PointLoopSpan::operator[](&loop_local,(int)loop_local.super_S2PointSpan.len_ + -1);
      pVVar3 = S2PointLoopSpan::operator[](&loop_local,0);
      (*pcVar4)(&old_origin,&origin,pVVar2,pVVar3);
      util::math::internal_vector::BasicVector<Vector3,double,3ul>::PlusEq<0ul,1ul,2ul>
                (__return_storage_ptr__,&old_origin);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

T GetSurfaceIntegral(S2PointLoopSpan loop,
                     T f_tri(const S2Point&, const S2Point&, const S2Point&)) {
  // We sum "f_tri" over a collection T of oriented triangles, possibly
  // overlapping.  Let the sign of a triangle be +1 if it is CCW and -1
  // otherwise, and let the sign of a point "x" be the sum of the signs of the
  // triangles containing "x".  Then the collection of triangles T is chosen
  // such that either:
  //
  //  (1) Each point in the loop interior has sign +1, and sign 0 otherwise; or
  //  (2) Each point in the loop exterior has sign -1, and sign 0 otherwise.
  //
  // The triangles basically consist of a "fan" from vertex 0 to every loop
  // edge that does not include vertex 0.  These triangles will always satisfy
  // either (1) or (2).  However, what makes this a bit tricky is that
  // spherical edges become numerically unstable as their length approaches
  // 180 degrees.  Of course there is not much we can do if the loop itself
  // contains such edges, but we would like to make sure that all the triangle
  // edges under our control (i.e., the non-loop edges) are stable.  For
  // example, consider a loop around the equator consisting of four equally
  // spaced points.  This is a well-defined loop, but we cannot just split it
  // into two triangles by connecting vertex 0 to vertex 2.
  //
  // We handle this type of situation by moving the origin of the triangle fan
  // whenever we are about to create an unstable edge.  We choose a new
  // location for the origin such that all relevant edges are stable.  We also
  // create extra triangles with the appropriate orientation so that the sum
  // of the triangle signs is still correct at every point.

  // The maximum length of an edge for it to be considered numerically stable.
  // The exact value is fairly arbitrary since it depends on the stability of
  // the "f_tri" function.  The value below is quite conservative but could be
  // reduced further if desired.
  static const double kMaxLength = M_PI - 1e-5;

  // The default constructor for T must initialize the value to zero.
  // (This is true for built-in types such as "double".)
  T sum = T();
  if (loop.size() < 3) return sum;

  S2Point origin = loop[0];
  for (int i = 1; i + 1 < loop.size(); ++i) {
    // Let V_i be loop[i], let O be the current origin, and let length(A,B)
    // be the length of edge (A,B).  At the start of each loop iteration, the
    // "leading edge" of the triangle fan is (O,V_i), and we want to extend
    // the triangle fan so that the leading edge is (O,V_i+1).
    //
    // Invariants:
    //  1. length(O,V_i) < kMaxLength for all (i > 1).
    //  2. Either O == V_0, or O is approximately perpendicular to V_0.
    //  3. "sum" is the oriented integral of f over the area defined by
    //     (O, V_0, V_1, ..., V_i).
    S2_DCHECK(i == 1 || origin.Angle(loop[i]) < kMaxLength);
    S2_DCHECK(origin == loop[0] || std::fabs(origin.DotProd(loop[0])) < 1e-15);

    if (loop[i + 1].Angle(origin) > kMaxLength) {
      // We are about to create an unstable edge, so choose a new origin O'
      // for the triangle fan.
      S2Point old_origin = origin;
      if (origin == loop[0]) {
        // The following point is well-separated from V_i and V_0 (and
        // therefore V_i+1 as well).
        origin = S2::RobustCrossProd(loop[0], loop[i]).Normalize();
      } else if (loop[i].Angle(loop[0]) < kMaxLength) {
        // All edges of the triangle (O, V_0, V_i) are stable, so we can
        // revert to using V_0 as the origin.
        origin = loop[0];
      } else {
        // (O, V_i+1) and (V_0, V_i) are antipodal pairs, and O and V_0 are
        // perpendicular.  Therefore V_0.CrossProd(O) is approximately
        // perpendicular to all of {O, V_0, V_i, V_i+1}, and we can choose
        // this point O' as the new origin.
        origin = loop[0].CrossProd(old_origin);

        // Advance the edge (V_0,O) to (V_0,O').
        sum += f_tri(loop[0], old_origin, origin);
      }
      // Advance the edge (O,V_i) to (O',V_i).
      sum += f_tri(old_origin, loop[i], origin);
    }
    // Advance the edge (O,V_i) to (O,V_i+1).
    sum += f_tri(origin, loop[i], loop[i+1]);
  }
  // If the origin is not V_0, we need to sum one more triangle.
  if (origin != loop[0]) {
    // Advance the edge (O,V_n-1) to (O,V_0).
    sum += f_tri(origin, loop[loop.size() - 1], loop[0]);
  }
  return sum;
}